

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

int trytypetag(rnndb *db,char *file,xmlNode *node,rnntypeinfo *ti)

{
  xmlChar *__s1;
  int iVar1;
  int iVar2;
  rnnbitfield *prVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  
  __s1 = node->name;
  iVar1 = strcmp((char *)__s1,"value");
  if (iVar1 == 0) {
    prVar3 = (rnnbitfield *)parsevalue(db,file,node);
    if (prVar3 == (rnnbitfield *)0x0) {
      return 1;
    }
    piVar7 = &ti->valsnum;
    iVar1 = ti->valsmax;
    lVar6 = 0x38;
    if (ti->valsnum < iVar1) goto LAB_001058fa;
    piVar5 = &ti->valsmax;
  }
  else {
    iVar1 = strcmp((char *)__s1,"bitfield");
    if (iVar1 != 0) {
      return 0;
    }
    prVar3 = parsebitfield(db,file,node);
    if (prVar3 == (rnnbitfield *)0x0) {
      return 1;
    }
    piVar7 = &ti->bitfieldsnum;
    iVar1 = ti->bitfieldsmax;
    lVar6 = 0x28;
    if (ti->bitfieldsnum < iVar1) goto LAB_001058fa;
    piVar5 = &ti->bitfieldsmax;
  }
  iVar2 = 0x10;
  if (iVar1 != 0) {
    iVar2 = iVar1 * 2;
  }
  *piVar5 = iVar2;
  pvVar4 = realloc(*(void **)((long)&ti->name + lVar6),(long)iVar2 << 3);
  *(void **)((long)&ti->name + lVar6) = pvVar4;
LAB_001058fa:
  lVar6 = *(long *)((long)&ti->name + lVar6);
  iVar1 = *piVar7;
  *piVar7 = iVar1 + 1;
  *(rnnbitfield **)(lVar6 + (long)iVar1 * 8) = prVar3;
  return 1;
}

Assistant:

static int trytypetag (struct rnndb *db, char *file, xmlNode *node, struct rnntypeinfo *ti) {
	if (!strcmp(node->name, "value")) {
		struct rnnvalue *val = parsevalue(db, file, node);
		if (val)
			ADDARRAY(ti->vals, val);
		return 1;
	} else if (!strcmp(node->name, "bitfield")) {
		struct rnnbitfield *bf = parsebitfield(db, file, node);
		if (bf)
			ADDARRAY(ti->bitfields, bf);
		return 1;
	}
	return 0;
}